

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_astring.c
# Opt level: O2

void test_AString_replaceAString_success_oldSmallerLengthThanRep_bufferExpanded_fn(int _i)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  char *pcVar4;
  char *expr;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  AString rep;
  AString old;
  AString string;
  
  private_ACUtilsTest_AString_constructTestString(&string,"xy012xy",8);
  private_ACUtilsTest_AString_constructTestString(&old,"xy",2);
  private_ACUtilsTest_AString_constructTestString(&rep,"abc",3);
  private_ACUtilsTest_AString_reallocFail = 0;
  bVar1 = AString_replaceAString(&string,&old,&rep,0);
  if (bVar1 == false) {
    _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x809,"Assertion \'AString_replaceAString(&string, &old, &rep, 0)\' failed",0
                      ,0);
  }
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
              ,0x809);
  if (string.capacity == 0x10) {
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                ,0x80a);
    if (string.buffer == (char *)0x0) {
      rep.size = 0;
      pcVar7 = (char *)0x0;
      expr = "Assertion \'_ck_x != NULL\' failed";
      pcVar4 = "Assertion \'%s\' failed: %s == %#x";
      pcVar5 = "(void*) (string).buffer != NULL";
      pcVar6 = "(void*) (string).buffer";
    }
    else {
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                  ,0x80a);
      pcVar7 = string.buffer;
      if (string.buffer == (char *)0x0) {
        rep.size = 0x16819b;
        pcVar7 = "(null)";
      }
      else {
        iVar2 = strcmp("abc012abc",string.buffer);
        if (iVar2 == 0) {
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x80a);
          if (string.size != 9) {
            pcVar7 = "strlen(\"abc012abc\")";
            expr = "Assertion \'_ck_x == _ck_y\' failed";
            pcVar4 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
            pcVar5 = "(string).size == strlen(\"abc012abc\")";
            pcVar6 = "(string).size";
            rep.size = string.size;
            goto LAB_00142d7f;
          }
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x80a);
          if (old.capacity == 2) {
            _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                        ,0x80b);
            if (old.buffer == (char *)0x0) {
              rep.size = 0;
              pcVar7 = (char *)0x0;
              expr = "Assertion \'_ck_x != NULL\' failed";
              pcVar4 = "Assertion \'%s\' failed: %s == %#x";
              pcVar5 = "(void*) (old).buffer != NULL";
              pcVar6 = "(void*) (old).buffer";
            }
            else {
              _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                          ,0x80b);
              if (old.buffer == (char *)0x0) {
                rep.size = 0x16819b;
                old.buffer = "(null)";
              }
              else {
                uVar3 = (byte)*old.buffer - 0x78;
                if ((uVar3 == 0) && (uVar3 = (byte)old.buffer[1] - 0x79, uVar3 == 0)) {
                  uVar3 = (uint)(byte)old.buffer[2];
                }
                if (uVar3 == 0) {
                  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                              ,0x80b);
                  if (old.size != 2) {
                    expr = "Assertion \'_ck_x == _ck_y\' failed";
                    pcVar4 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
                    pcVar5 = "(old).size == strlen(\"xy\")";
                    pcVar6 = "(old).size";
                    rep.size = old.size;
                    pcVar7 = "strlen(\"xy\")";
                    goto LAB_00142eb3;
                  }
                  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                              ,0x80b);
                  if (rep.capacity == 3) {
                    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                ,0x80c);
                    if (rep.buffer == (char *)0x0) {
                      rep.size = 0;
                      pcVar7 = (char *)0x0;
                      expr = "Assertion \'_ck_x != NULL\' failed";
                      pcVar4 = "Assertion \'%s\' failed: %s == %#x";
                      pcVar5 = "(void*) (rep).buffer != NULL";
                      pcVar6 = "(void*) (rep).buffer";
                    }
                    else {
                      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                  ,0x80c);
                      pcVar7 = rep.buffer;
                      if (rep.buffer == (char *)0x0) {
                        pcVar7 = "(null)";
                        rep.size = 0x16819b;
                      }
                      else {
                        iVar2 = strcmp("abc",rep.buffer);
                        if (iVar2 == 0) {
                          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                      ,0x80c);
                          if (rep.size == 3) {
                            _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                        ,0x80c);
                            if (private_ACUtilsTest_AString_reallocCount == 1) {
                              _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                          ,0x80d);
                              (*string.deallocator)(string.buffer);
                              (*old.deallocator)(old.buffer);
                              (*rep.deallocator)(rep.buffer);
                              return;
                            }
                            pcVar7 = "(1)";
                            expr = "Assertion \'_ck_x == _ck_y\' failed";
                            pcVar4 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
                            pcVar5 = "private_ACUtilsTest_AString_reallocCount == (1)";
                            pcVar6 = "private_ACUtilsTest_AString_reallocCount";
                            iVar2 = 0x80d;
                            rep.size = private_ACUtilsTest_AString_reallocCount;
                            goto LAB_00142fec;
                          }
                          pcVar7 = "strlen(\"abc\")";
                          expr = "Assertion \'_ck_x == _ck_y\' failed";
                          pcVar4 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
                          pcVar5 = "(rep).size == strlen(\"abc\")";
                          pcVar6 = "(rep).size";
                          goto LAB_00142fe7;
                        }
                        rep.size = 0x15c553;
                      }
                      expr = 
                      "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
                      ;
                      pcVar4 = "Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s";
                      pcVar5 = "(rep).buffer == (\"abc\")";
                      pcVar6 = "(rep).buffer";
                    }
                  }
                  else {
                    pcVar7 = "(3)";
                    expr = "Assertion \'_ck_x == _ck_y\' failed";
                    pcVar4 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
                    pcVar5 = "(rep).capacity == (3)";
                    pcVar6 = "(rep).capacity";
                    rep.size = rep.capacity;
                  }
LAB_00142fe7:
                  iVar2 = 0x80c;
                  goto LAB_00142fec;
                }
                rep.size = 0x15c553;
              }
              expr = 
              "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
              ;
              pcVar4 = "Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s";
              pcVar5 = "(old).buffer == (\"xy\")";
              pcVar6 = "(old).buffer";
              pcVar7 = old.buffer;
            }
          }
          else {
            pcVar7 = "(2)";
            expr = "Assertion \'_ck_x == _ck_y\' failed";
            pcVar4 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
            pcVar5 = "(old).capacity == (2)";
            pcVar6 = "(old).capacity";
            rep.size = old.capacity;
          }
LAB_00142eb3:
          iVar2 = 0x80b;
          goto LAB_00142fec;
        }
        rep.size = 0x15c553;
      }
      expr = 
      "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
      ;
      pcVar4 = "Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s";
      pcVar5 = "(string).buffer == (\"abc012abc\")";
      pcVar6 = "(string).buffer";
    }
  }
  else {
    pcVar7 = "(16)";
    expr = "Assertion \'_ck_x == _ck_y\' failed";
    pcVar4 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
    pcVar5 = "(string).capacity == (16)";
    pcVar6 = "(string).capacity";
    rep.size = string.capacity;
  }
LAB_00142d7f:
  iVar2 = 0x80a;
LAB_00142fec:
  _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                    ,iVar2,expr,pcVar4,pcVar5,pcVar6,rep.size,pcVar7);
}

Assistant:

END_TEST
START_TEST(test_AString_replaceAString_success_oldSmallerLengthThanRep_bufferExpanded)
{
    struct AString string = private_ACUtilsTest_AString_constructTestString("xy012xy", 8);
    struct AString old = private_ACUtilsTest_AString_constructTestString("xy", 2);
    struct AString rep = private_ACUtilsTest_AString_constructTestString("abc", 3);
    private_ACUtilsTest_AString_setReallocFail(false, 0);
    ACUTILSTEST_ASSERT(AString_replaceAString(&string, &old, &rep, 0));
    ACUTILSTEST_ASTRING_CHECK_ASTRING(string, "abc012abc", 16);
    ACUTILSTEST_ASTRING_CHECK_ASTRING(old, "xy", 2);
    ACUTILSTEST_ASTRING_CHECK_ASTRING(rep, "abc", 3);
    ACUTILSTEST_ASTRING_CHECK_REALLOC(1);
    private_ACUtilsTest_AString_destructTestString(string);
    private_ACUtilsTest_AString_destructTestString(old);
    private_ACUtilsTest_AString_destructTestString(rep);
}